

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

void hdr_reset_internal_counters(hdr_histogram *h)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int64_t iVar13;
  
  lVar7 = 0x7fffffffffffffff;
  if ((long)h->counts_len < 1) {
    h->max_value = 0;
    lVar5 = 0;
  }
  else {
    uVar8 = 0xffffffff;
    uVar12 = 0;
    uVar11 = 0xffffffff;
    lVar5 = 0;
    do {
      if (0 < h->counts[uVar12]) {
        lVar5 = lVar5 + h->counts[uVar12];
        uVar9 = uVar8;
        if (uVar8 == 0xffffffff) {
          uVar9 = (uint)uVar12;
        }
        if (uVar12 != 0) {
          uVar8 = uVar9;
        }
        uVar11 = uVar12 & 0xffffffff;
      }
      uVar12 = uVar12 + 1;
    } while ((long)h->counts_len != uVar12);
    iVar13 = 0;
    uVar9 = (uint)uVar11;
    if (uVar9 != 0xffffffff) {
      bVar3 = (byte)h->sub_bucket_half_count_magnitude;
      iVar6 = (int)uVar9 >> (bVar3 & 0x1f);
      iVar2 = h->sub_bucket_half_count;
      iVar10 = iVar6 + -1;
      if (iVar6 < 1) {
        iVar2 = 0;
        iVar10 = 0;
      }
      uVar12 = (long)(int)(iVar2 + (h->sub_bucket_half_count - 1U & uVar9)) <<
               ((char)iVar10 + (char)h->unit_magnitude & 0x3fU);
      uVar11 = h->sub_bucket_mask | uVar12;
      lVar1 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar3 = 0x3f - (((byte)lVar1 ^ 0x3f) + bVar3);
      iVar10 = (int)((long)uVar12 >> (bVar3 & 0x3f));
      iVar13 = ((long)iVar10 << (bVar3 & 0x3f)) +
               (1L << ((h->sub_bucket_count <= iVar10) + bVar3 & 0x3f)) + -1;
    }
    h->max_value = iVar13;
    if (uVar8 != 0xffffffff) {
      iVar2 = (int)uVar8 >> ((byte)h->sub_bucket_half_count_magnitude & 0x1f);
      cVar4 = (char)iVar2 + -1;
      iVar10 = h->sub_bucket_half_count;
      uVar9 = iVar10 - 1;
      if (iVar2 < 1) {
        cVar4 = '\0';
        iVar10 = 0;
      }
      lVar7 = (long)(int)(iVar10 + (uVar9 & uVar8)) << (cVar4 + (char)h->unit_magnitude & 0x3fU);
    }
  }
  h->min_value = lVar7;
  h->total_count = lVar5;
  return;
}

Assistant:

void hdr_reset_internal_counters(struct hdr_histogram* h)
{
    int min_non_zero_index = -1;
    int max_index = -1;
    int64_t observed_total_count = 0;
    int i;

    for (i = 0; i < h->counts_len; i++)
    {
        int64_t count_at_index;

        if ((count_at_index = counts_get_direct(h, i)) > 0)
        {
            observed_total_count += count_at_index;
            max_index = i;
            if (min_non_zero_index == -1 && i != 0)
            {
                min_non_zero_index = i;
            }
        }
    }

    if (max_index == -1)
    {
        h->max_value = 0;
    }
    else
    {
        int64_t max_value = hdr_value_at_index(h, max_index);
        h->max_value = highest_equivalent_value(h, max_value);
    }

    if (min_non_zero_index == -1)
    {
        h->min_value = INT64_MAX;
    }
    else
    {
        h->min_value = hdr_value_at_index(h, min_non_zero_index);
    }

    h->total_count = observed_total_count;
}